

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9Texture.cpp
# Opt level: O0

GMM_GFX_SIZE_T __thiscall
GmmLib::GmmGen9TextureCalc::Get1DTexOffsetAddressPerMip
          (GmmGen9TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t MipLevel)

{
  uint uVar1;
  uint32_t local_64;
  uint32_t local_58;
  uint32_t local_54;
  uint32_t local_48;
  uint local_44;
  uint32_t CompressDepth;
  uint32_t CompressWidth;
  uint32_t CompressHeight;
  uint8_t Compressed;
  GMM_GFX_SIZE_T MipOffset;
  uint32_t HAlign;
  uint32_t i;
  uint32_t __MipLevel;
  uint32_t MipWidth;
  uint32_t AlignedMipWidth;
  uint32_t MipLevel_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmGen9TextureCalc *this_local;
  
  _CompressHeight = 0;
  MipOffset._0_4_ = (pTexInfo->Alignment).HAlign;
  i = (uint32_t)pTexInfo->BaseWidth;
  if (((((ulong)(pTexInfo->Flags).Info >> 0x25 & 1) != 0) ||
      (((ulong)(pTexInfo->Flags).Info >> 0x26 & 1) != 0)) ||
     (local_58 = MipLevel, ((ulong)(pTexInfo->Flags).Info >> 0x2c & 1) != 0)) {
    local_54 = MipLevel;
    if ((pTexInfo->Alignment).MipTailStartLod <= MipLevel) {
      local_54 = (pTexInfo->Alignment).MipTailStartLod;
    }
    local_58 = local_54;
  }
  HAlign = local_58;
  MipWidth = MipLevel;
  _AlignedMipWidth = pTexInfo;
  pTexInfo_local = (GMM_TEXTURE_INFO *)this;
  CompressWidth._3_1_ =
       GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,pTexInfo->Format);
  GmmTextureCalc::GetCompressionBlockDimensions
            (&this->super_GmmTextureCalc,_AlignedMipWidth->Format,&local_44,&CompressDepth,&local_48
            );
  for (MipOffset._4_4_ = 1; MipOffset._4_4_ <= HAlign; MipOffset._4_4_ = MipOffset._4_4_ + 1) {
    if ((((ulong)(_AlignedMipWidth->Flags).Gpu >> 6 & 1) == 0) &&
       (((ulong)(_AlignedMipWidth->Flags).Gpu >> 0x1d & 1) == 0)) {
      local_64 = 1;
    }
    else {
      local_64 = (_AlignedMipWidth->MSAA).NumSamples;
    }
    __MipLevel = GmmTextureCalc::ExpandWidth
                           (&this->super_GmmTextureCalc,i,(uint32_t)MipOffset,local_64);
    if (CompressWidth._3_1_ != '\0') {
      __MipLevel = __MipLevel / local_44;
    }
    _CompressHeight = __MipLevel + _CompressHeight;
    i = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[0x18])
                  (this,_AlignedMipWidth,(ulong)MipOffset._4_4_);
  }
  _CompressHeight = (_AlignedMipWidth->BitsPerPixel >> 3) * _CompressHeight;
  if ((((((ulong)(_AlignedMipWidth->Flags).Info >> 0x25 & 1) != 0) ||
       (((ulong)(_AlignedMipWidth->Flags).Info >> 0x26 & 1) != 0)) ||
      (((ulong)(_AlignedMipWidth->Flags).Info >> 0x2c & 1) != 0)) &&
     ((_AlignedMipWidth->Alignment).MipTailStartLod <= MipWidth)) {
    uVar1 = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[9])
                      (this,_AlignedMipWidth,(ulong)MipWidth);
    _CompressHeight = uVar1 + _CompressHeight;
  }
  return _CompressHeight;
}

Assistant:

GMM_GFX_SIZE_T GmmLib::GmmGen9TextureCalc::Get1DTexOffsetAddressPerMip(GMM_TEXTURE_INFO *pTexInfo,
                                                                       uint32_t          MipLevel)
{
    uint32_t       AlignedMipWidth, MipWidth, __MipLevel;
    uint32_t       i, HAlign;
    GMM_GFX_SIZE_T MipOffset = 0;
    uint8_t        Compressed;
    uint32_t       CompressHeight, CompressWidth, CompressDepth;

    GMM_DPF_ENTER;

    HAlign   = pTexInfo->Alignment.HAlign;
    MipWidth = GFX_ULONG_CAST(pTexInfo->BaseWidth);

    __MipLevel =
    (pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) ?
    GFX_MIN(MipLevel, pTexInfo->Alignment.MipTailStartLod) :
    MipLevel;

    Compressed = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);
    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    for(i = 1; i <= __MipLevel; i++)
    {
        AlignedMipWidth = __GMM_EXPAND_WIDTH(this, MipWidth, HAlign, pTexInfo);

        if(Compressed)
        {
            AlignedMipWidth /= CompressWidth;
        }

        MipOffset += AlignedMipWidth;

        MipWidth = GFX_ULONG_CAST(GmmTexGetMipWidth(pTexInfo, i));
    }

    MipOffset *= (pTexInfo->BitsPerPixel >> 3);

    if((pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
       (MipLevel >= pTexInfo->Alignment.MipTailStartLod))
    {
        MipOffset += GetMipTailByteOffset(pTexInfo, MipLevel);
    }

    GMM_DPF_EXIT;

    return (MipOffset);
}